

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentAggregateSystem.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::SilentAggregateSystem::Decode(SilentAggregateSystem *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xb < KVar1) {
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumAggregates);
    (*(this->m_AggTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_AggTyp,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void SilentAggregateSystem::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < SilentAggregateSystem::SILENT_AGGREGATE_SYSTEM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16NumAggregates
           >> KDIS_STREAM m_AggTyp
           >> m_ui16Padding;
}